

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall sector_t::LowestFloorAt(sector_t *this,DVector2 *p,sector_t **resultsec)

{
  double dVar1;
  double local_40;
  DVector2 local_38;
  
  local_38 = *p;
  local_40 = 3.4028234663852886e+38;
  while ((this->planes[0].Flags & 0x1d0U) == 0x100) {
    if (local_40 < sectorPortals.Array[this->Portals[0]].mPlaneZ ||
        local_40 == sectorPortals.Array[this->Portals[0]].mPlaneZ) break;
    dVar1 = sectorPortals.Array[this->Portals[0]].mDisplacement.Y + local_38.Y;
    local_38.Y._0_4_ = SUB84(dVar1,0);
    local_38.X = sectorPortals.Array[this->Portals[0]].mDisplacement.X + local_38.X;
    local_38.Y._4_4_ = (int)((ulong)dVar1 >> 0x20);
    local_40 = sectorPortals.Array[this->Portals[1]].mPlaneZ;
    this = P_PointInSector(&local_38);
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = this;
  }
  dVar1 = secplane_t::ZatPoint(&this->floorplane,&local_38);
  return dVar1;
}

Assistant:

double sector_t::LowestFloorAt(const DVector2 &p, sector_t **resultsec)
{
	sector_t *check = this;
	double planeheight = FLT_MAX;
	DVector2 pos = p;

	// Continue until we find a blocking portal or a portal above where we actually are.
	while (!check->PortalBlocksMovement(floor) && planeheight > check->GetPortalPlaneZ(floor))
	{
		pos += check->GetPortalDisplacement(floor);
		planeheight = check->GetPortalPlaneZ(ceiling);
		check = P_PointInSector(pos);
	}
	if (resultsec) *resultsec = check;
	return check->floorplane.ZatPoint(pos);
}